

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.cpp
# Opt level: O0

vector<RPCResult,_std::allocator<RPCResult>_> * MempoolEntryDescription(void)

{
  initializer_list<RPCResult> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_RDI;
  long in_FS_OFFSET;
  RPCResult *in_stack_ffffffffffffe9d8;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_ffffffffffffe9e8;
  allocator_type *in_stack_ffffffffffffea10;
  allocator<char> *in_stack_ffffffffffffea18;
  iterator in_stack_ffffffffffffea20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffea28;
  undefined1 in_stack_ffffffffffffea3f;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_ffffffffffffea40;
  string *in_stack_ffffffffffffea48;
  string *in_stack_ffffffffffffea50;
  Type in_stack_ffffffffffffea5c;
  RPCResult *in_stack_ffffffffffffea60;
  undefined1 *local_1568;
  undefined1 *local_1550;
  undefined1 *local_1538;
  long *local_1520;
  allocator<char> local_120a;
  allocator<char> local_1209;
  undefined8 local_1208;
  undefined8 uStack_1200;
  undefined8 local_11f8;
  allocator<char> local_11eb;
  allocator<char> local_11ea [2];
  undefined8 local_11e8;
  undefined8 uStack_11e0;
  undefined8 local_11d8;
  allocator<char> local_11ca;
  allocator<char> local_11c9 [30];
  allocator<char> local_11ab;
  allocator<char> local_11aa [2];
  undefined8 local_11a8;
  undefined8 uStack_11a0;
  undefined8 local_1198;
  allocator<char> local_118a;
  allocator<char> local_1189 [30];
  allocator<char> local_116b;
  allocator<char> local_116a [2];
  undefined8 local_1168;
  undefined8 uStack_1160;
  undefined8 local_1158;
  allocator<char> local_1149;
  undefined8 local_1148;
  undefined8 uStack_1140;
  undefined8 local_1138;
  allocator<char> local_1129;
  undefined8 local_1128;
  undefined8 uStack_1120;
  undefined8 local_1118;
  allocator<char> local_1109;
  undefined8 local_1108;
  undefined8 uStack_1100;
  undefined8 local_10f8;
  allocator<char> local_10e9 [31];
  allocator<char> local_10ca;
  allocator<char> local_10c9;
  undefined8 local_10c8;
  undefined8 uStack_10c0;
  undefined8 local_10b8;
  allocator<char> local_10aa;
  allocator<char> local_10a9;
  undefined8 local_10a8;
  undefined8 uStack_10a0;
  undefined8 local_1098;
  allocator<char> local_108a;
  allocator<char> local_1089;
  undefined8 local_1088;
  undefined8 uStack_1080;
  undefined8 local_1078;
  allocator<char> local_106a;
  allocator<char> local_1069;
  undefined8 local_1068;
  undefined8 uStack_1060;
  undefined8 local_1058;
  allocator<char> local_104a;
  allocator<char> local_1049;
  undefined8 local_1048;
  undefined8 uStack_1040;
  undefined8 local_1038;
  allocator<char> local_102a;
  allocator<char> local_1029;
  undefined8 local_1028;
  undefined8 uStack_1020;
  undefined8 local_1018;
  allocator<char> local_100a;
  allocator<char> local_1009;
  undefined8 local_1008;
  undefined8 uStack_1000;
  undefined8 local_ff8;
  allocator<char> local_fea;
  allocator<char> local_fe9;
  undefined8 local_fe8;
  undefined8 uStack_fe0;
  undefined8 local_fd8;
  allocator<char> local_fca;
  allocator<char> local_fc9;
  undefined8 local_fc8;
  undefined8 uStack_fc0;
  undefined8 local_fb8;
  allocator<char> local_faa;
  allocator<char> local_fa9 [193];
  undefined1 local_ee8 [136];
  undefined1 local_e60 [128];
  undefined1 local_de0 [136];
  undefined1 local_d58 [320];
  undefined1 local_c18 [544];
  undefined1 local_9f8 [640];
  long local_778 [238];
  long local_8;
  
  uStack_1000 = 0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea28,(char *)in_stack_ffffffffffffea20,in_stack_ffffffffffffea18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea28,(char *)in_stack_ffffffffffffea20,in_stack_ffffffffffffea18);
  local_fc8 = 0;
  uStack_fc0 = 0;
  local_fb8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe9d8);
  RPCResult::RPCResult
            (in_stack_ffffffffffffea60,in_stack_ffffffffffffea5c,in_stack_ffffffffffffea50,
             in_stack_ffffffffffffea48,in_stack_ffffffffffffea40,(bool)in_stack_ffffffffffffea3f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea28,(char *)in_stack_ffffffffffffea20,in_stack_ffffffffffffea18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea28,(char *)in_stack_ffffffffffffea20,in_stack_ffffffffffffea18);
  local_fe8 = 0;
  uStack_fe0 = 0;
  local_fd8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe9d8);
  RPCResult::RPCResult
            (in_stack_ffffffffffffea60,in_stack_ffffffffffffea5c,in_stack_ffffffffffffea50,
             in_stack_ffffffffffffea48,in_stack_ffffffffffffea40,(bool)in_stack_ffffffffffffea3f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea28,(char *)in_stack_ffffffffffffea20,in_stack_ffffffffffffea18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea28,(char *)in_stack_ffffffffffffea20,in_stack_ffffffffffffea18);
  local_1008 = 0;
  uStack_1000 = 0;
  local_ff8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe9d8);
  RPCResult::RPCResult
            (in_stack_ffffffffffffea60,in_stack_ffffffffffffea5c,in_stack_ffffffffffffea50,
             in_stack_ffffffffffffea48,in_stack_ffffffffffffea40,(bool)in_stack_ffffffffffffea3f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea28,(char *)in_stack_ffffffffffffea20,in_stack_ffffffffffffea18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea28,(char *)in_stack_ffffffffffffea20,in_stack_ffffffffffffea18);
  local_1028 = 0;
  uStack_1020 = 0;
  local_1018 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe9d8);
  RPCResult::RPCResult
            (in_stack_ffffffffffffea60,in_stack_ffffffffffffea5c,in_stack_ffffffffffffea50,
             in_stack_ffffffffffffea48,in_stack_ffffffffffffea40,(bool)in_stack_ffffffffffffea3f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea28,(char *)in_stack_ffffffffffffea20,in_stack_ffffffffffffea18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea28,(char *)in_stack_ffffffffffffea20,in_stack_ffffffffffffea18);
  local_1048 = 0;
  uStack_1040 = 0;
  local_1038 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe9d8);
  RPCResult::RPCResult
            (in_stack_ffffffffffffea60,in_stack_ffffffffffffea5c,in_stack_ffffffffffffea50,
             in_stack_ffffffffffffea48,in_stack_ffffffffffffea40,(bool)in_stack_ffffffffffffea3f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea28,(char *)in_stack_ffffffffffffea20,in_stack_ffffffffffffea18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea28,(char *)in_stack_ffffffffffffea20,in_stack_ffffffffffffea18);
  local_1068 = 0;
  uStack_1060 = 0;
  local_1058 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe9d8);
  RPCResult::RPCResult
            (in_stack_ffffffffffffea60,in_stack_ffffffffffffea5c,in_stack_ffffffffffffea50,
             in_stack_ffffffffffffea48,in_stack_ffffffffffffea40,(bool)in_stack_ffffffffffffea3f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea28,(char *)in_stack_ffffffffffffea20,in_stack_ffffffffffffea18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea28,(char *)in_stack_ffffffffffffea20,in_stack_ffffffffffffea18);
  local_1088 = 0;
  uStack_1080 = 0;
  local_1078 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe9d8);
  RPCResult::RPCResult
            (in_stack_ffffffffffffea60,in_stack_ffffffffffffea5c,in_stack_ffffffffffffea50,
             in_stack_ffffffffffffea48,in_stack_ffffffffffffea40,(bool)in_stack_ffffffffffffea3f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea28,(char *)in_stack_ffffffffffffea20,in_stack_ffffffffffffea18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea28,(char *)in_stack_ffffffffffffea20,in_stack_ffffffffffffea18);
  local_10a8 = 0;
  uStack_10a0 = 0;
  local_1098 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe9d8);
  RPCResult::RPCResult
            (in_stack_ffffffffffffea60,in_stack_ffffffffffffea5c,in_stack_ffffffffffffea50,
             in_stack_ffffffffffffea48,in_stack_ffffffffffffea40,(bool)in_stack_ffffffffffffea3f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea28,(char *)in_stack_ffffffffffffea20,in_stack_ffffffffffffea18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea28,(char *)in_stack_ffffffffffffea20,in_stack_ffffffffffffea18);
  local_10c8 = 0;
  uStack_10c0 = 0;
  local_10b8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe9d8);
  RPCResult::RPCResult
            (in_stack_ffffffffffffea60,in_stack_ffffffffffffea5c,in_stack_ffffffffffffea50,
             in_stack_ffffffffffffea48,in_stack_ffffffffffffea40,(bool)in_stack_ffffffffffffea3f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea28,(char *)in_stack_ffffffffffffea20,in_stack_ffffffffffffea18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea28,(char *)in_stack_ffffffffffffea20,in_stack_ffffffffffffea18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea28,(char *)in_stack_ffffffffffffea20,in_stack_ffffffffffffea18);
  std::operator+((char *)in_stack_ffffffffffffea28,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffea20);
  local_1108 = 0;
  uStack_1100 = 0;
  local_10f8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe9d8);
  RPCResult::RPCResult
            (in_stack_ffffffffffffea60,in_stack_ffffffffffffea5c,in_stack_ffffffffffffea50,
             in_stack_ffffffffffffea48,in_stack_ffffffffffffea40,(bool)in_stack_ffffffffffffea3f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea28,(char *)in_stack_ffffffffffffea20,in_stack_ffffffffffffea18);
  std::operator+((char *)in_stack_ffffffffffffea28,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffea20);
  local_1128 = 0;
  uStack_1120 = 0;
  local_1118 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe9d8);
  RPCResult::RPCResult
            (in_stack_ffffffffffffea60,in_stack_ffffffffffffea5c,in_stack_ffffffffffffea50,
             in_stack_ffffffffffffea48,in_stack_ffffffffffffea40,(bool)in_stack_ffffffffffffea3f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea28,(char *)in_stack_ffffffffffffea20,in_stack_ffffffffffffea18);
  std::operator+((char *)in_stack_ffffffffffffea28,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffea20);
  local_1148 = 0;
  uStack_1140 = 0;
  local_1138 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe9d8);
  RPCResult::RPCResult
            (in_stack_ffffffffffffea60,in_stack_ffffffffffffea5c,in_stack_ffffffffffffea50,
             in_stack_ffffffffffffea48,in_stack_ffffffffffffea40,(bool)in_stack_ffffffffffffea3f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea28,(char *)in_stack_ffffffffffffea20,in_stack_ffffffffffffea18);
  std::operator+((char *)in_stack_ffffffffffffea28,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffea20);
  local_1168 = 0;
  uStack_1160 = 0;
  local_1158 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe9d8);
  RPCResult::RPCResult
            (in_stack_ffffffffffffea60,in_stack_ffffffffffffea5c,in_stack_ffffffffffffea50,
             in_stack_ffffffffffffea48,in_stack_ffffffffffffea40,(bool)in_stack_ffffffffffffea3f);
  std::allocator<RPCResult>::allocator((allocator<RPCResult> *)in_stack_ffffffffffffe9d8);
  __l._M_len = (size_type)in_stack_ffffffffffffea28;
  __l._M_array = in_stack_ffffffffffffea20;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffea18,__l,
             in_stack_ffffffffffffea10);
  RPCResult::RPCResult
            (in_stack_ffffffffffffea60,in_stack_ffffffffffffea5c,in_stack_ffffffffffffea50,
             in_stack_ffffffffffffea48,in_stack_ffffffffffffea40,(bool)in_stack_ffffffffffffea3f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea28,(char *)in_stack_ffffffffffffea20,in_stack_ffffffffffffea18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea28,(char *)in_stack_ffffffffffffea20,in_stack_ffffffffffffea18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea28,(char *)in_stack_ffffffffffffea20,in_stack_ffffffffffffea18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea28,(char *)in_stack_ffffffffffffea20,in_stack_ffffffffffffea18);
  local_11a8 = 0;
  uStack_11a0 = 0;
  local_1198 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe9d8);
  RPCResult::RPCResult
            (in_stack_ffffffffffffea60,in_stack_ffffffffffffea5c,in_stack_ffffffffffffea50,
             in_stack_ffffffffffffea48,in_stack_ffffffffffffea40,(bool)in_stack_ffffffffffffea3f);
  std::allocator<RPCResult>::allocator((allocator<RPCResult> *)in_stack_ffffffffffffe9d8);
  __l_00._M_len = (size_type)in_stack_ffffffffffffea28;
  __l_00._M_array = in_stack_ffffffffffffea20;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffea18,__l_00,
             in_stack_ffffffffffffea10);
  RPCResult::RPCResult
            (in_stack_ffffffffffffea60,in_stack_ffffffffffffea5c,in_stack_ffffffffffffea50,
             in_stack_ffffffffffffea48,in_stack_ffffffffffffea40,(bool)in_stack_ffffffffffffea3f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea28,(char *)in_stack_ffffffffffffea20,in_stack_ffffffffffffea18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea28,(char *)in_stack_ffffffffffffea20,in_stack_ffffffffffffea18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea28,(char *)in_stack_ffffffffffffea20,in_stack_ffffffffffffea18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea28,(char *)in_stack_ffffffffffffea20,in_stack_ffffffffffffea18);
  local_11e8 = 0;
  uStack_11e0 = 0;
  local_11d8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe9d8);
  RPCResult::RPCResult
            (in_stack_ffffffffffffea60,in_stack_ffffffffffffea5c,in_stack_ffffffffffffea50,
             in_stack_ffffffffffffea48,in_stack_ffffffffffffea40,(bool)in_stack_ffffffffffffea3f);
  std::allocator<RPCResult>::allocator((allocator<RPCResult> *)in_stack_ffffffffffffe9d8);
  __l_01._M_len = (size_type)in_stack_ffffffffffffea28;
  __l_01._M_array = in_stack_ffffffffffffea20;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffea18,__l_01,
             in_stack_ffffffffffffea10);
  RPCResult::RPCResult
            (in_stack_ffffffffffffea60,in_stack_ffffffffffffea5c,in_stack_ffffffffffffea50,
             in_stack_ffffffffffffea48,in_stack_ffffffffffffea40,(bool)in_stack_ffffffffffffea3f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea28,(char *)in_stack_ffffffffffffea20,in_stack_ffffffffffffea18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea28,(char *)in_stack_ffffffffffffea20,in_stack_ffffffffffffea18);
  local_1208 = 0;
  uStack_1200 = 0;
  local_11f8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe9d8);
  RPCResult::RPCResult
            (in_stack_ffffffffffffea60,in_stack_ffffffffffffea5c,in_stack_ffffffffffffea50,
             in_stack_ffffffffffffea48,in_stack_ffffffffffffea40,(bool)in_stack_ffffffffffffea3f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea28,(char *)in_stack_ffffffffffffea20,in_stack_ffffffffffffea18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea28,(char *)in_stack_ffffffffffffea20,in_stack_ffffffffffffea18);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe9d8);
  RPCResult::RPCResult
            (in_stack_ffffffffffffea60,in_stack_ffffffffffffea5c,in_stack_ffffffffffffea50,
             in_stack_ffffffffffffea48,in_stack_ffffffffffffea40,(bool)in_stack_ffffffffffffea3f);
  std::allocator<RPCResult>::allocator((allocator<RPCResult> *)in_stack_ffffffffffffe9d8);
  __l_02._M_len = (size_type)in_stack_ffffffffffffea28;
  __l_02._M_array = in_stack_ffffffffffffea20;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffea18,__l_02,
             in_stack_ffffffffffffea10);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)in_stack_ffffffffffffe9d8);
  local_1520 = &local_8;
  do {
    local_1520 = local_1520 + -0x11;
    RPCResult::~RPCResult(in_stack_ffffffffffffe9d8);
  } while (local_1520 != local_778);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe9e8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe9d8);
  std::allocator<char>::~allocator(&local_120a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe9d8);
  std::allocator<char>::~allocator(&local_1209);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe9e8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe9d8);
  std::allocator<char>::~allocator(&local_11eb);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe9d8);
  std::allocator<char>::~allocator(local_11ea);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe9e8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)in_stack_ffffffffffffe9d8);
  local_1538 = local_e60;
  do {
    local_1538 = local_1538 + -0x88;
    RPCResult::~RPCResult(in_stack_ffffffffffffe9d8);
  } while (local_1538 != local_ee8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe9e8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe9d8);
  std::allocator<char>::~allocator(&local_11ca);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe9d8);
  std::allocator<char>::~allocator(local_11c9);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe9d8);
  std::allocator<char>::~allocator(&local_11ab);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe9d8);
  std::allocator<char>::~allocator(local_11aa);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe9e8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)in_stack_ffffffffffffe9d8);
  local_1550 = local_d58;
  do {
    local_1550 = local_1550 + -0x88;
    RPCResult::~RPCResult(in_stack_ffffffffffffe9d8);
  } while (local_1550 != local_de0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe9e8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe9d8);
  std::allocator<char>::~allocator(&local_118a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe9d8);
  std::allocator<char>::~allocator(local_1189);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe9d8);
  std::allocator<char>::~allocator(&local_116b);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe9d8);
  std::allocator<char>::~allocator(local_116a);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe9e8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)in_stack_ffffffffffffe9d8);
  local_1568 = local_9f8;
  do {
    local_1568 = local_1568 + -0x88;
    RPCResult::~RPCResult(in_stack_ffffffffffffe9d8);
  } while (local_1568 != local_c18);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe9e8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe9d8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe9d8);
  std::allocator<char>::~allocator(&local_1149);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe9e8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe9d8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe9d8);
  std::allocator<char>::~allocator(&local_1129);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe9e8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe9d8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe9d8);
  std::allocator<char>::~allocator(&local_1109);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe9e8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe9d8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe9d8);
  std::allocator<char>::~allocator(local_10e9);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe9d8);
  std::allocator<char>::~allocator(&local_10ca);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe9d8);
  std::allocator<char>::~allocator(&local_10c9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe9e8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe9d8);
  std::allocator<char>::~allocator(&local_10aa);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe9d8);
  std::allocator<char>::~allocator(&local_10a9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe9e8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe9d8);
  std::allocator<char>::~allocator(&local_108a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe9d8);
  std::allocator<char>::~allocator(&local_1089);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe9e8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe9d8);
  std::allocator<char>::~allocator(&local_106a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe9d8);
  std::allocator<char>::~allocator(&local_1069);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe9e8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe9d8);
  std::allocator<char>::~allocator(&local_104a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe9d8);
  std::allocator<char>::~allocator(&local_1049);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe9e8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe9d8);
  std::allocator<char>::~allocator(&local_102a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe9d8);
  std::allocator<char>::~allocator(&local_1029);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe9e8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe9d8);
  std::allocator<char>::~allocator(&local_100a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe9d8);
  std::allocator<char>::~allocator(&local_1009);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe9e8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe9d8);
  std::allocator<char>::~allocator(&local_fea);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe9d8);
  std::allocator<char>::~allocator(&local_fe9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe9e8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe9d8);
  std::allocator<char>::~allocator(&local_fca);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe9d8);
  std::allocator<char>::~allocator(&local_fc9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe9e8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe9d8);
  std::allocator<char>::~allocator(&local_faa);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe9d8);
  std::allocator<char>::~allocator(local_fa9);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static std::vector<RPCResult> MempoolEntryDescription()
{
    return {
        RPCResult{RPCResult::Type::NUM, "vsize", "virtual transaction size as defined in BIP 141. This is different from actual serialized size for witness transactions as witness data is discounted."},
        RPCResult{RPCResult::Type::NUM, "weight", "transaction weight as defined in BIP 141."},
        RPCResult{RPCResult::Type::NUM_TIME, "time", "local time transaction entered pool in seconds since 1 Jan 1970 GMT"},
        RPCResult{RPCResult::Type::NUM, "height", "block height when transaction entered pool"},
        RPCResult{RPCResult::Type::NUM, "descendantcount", "number of in-mempool descendant transactions (including this one)"},
        RPCResult{RPCResult::Type::NUM, "descendantsize", "virtual transaction size of in-mempool descendants (including this one)"},
        RPCResult{RPCResult::Type::NUM, "ancestorcount", "number of in-mempool ancestor transactions (including this one)"},
        RPCResult{RPCResult::Type::NUM, "ancestorsize", "virtual transaction size of in-mempool ancestors (including this one)"},
        RPCResult{RPCResult::Type::STR_HEX, "wtxid", "hash of serialized transaction, including witness data"},
        RPCResult{RPCResult::Type::OBJ, "fees", "",
            {
                RPCResult{RPCResult::Type::STR_AMOUNT, "base", "transaction fee, denominated in " + CURRENCY_UNIT},
                RPCResult{RPCResult::Type::STR_AMOUNT, "modified", "transaction fee with fee deltas used for mining priority, denominated in " + CURRENCY_UNIT},
                RPCResult{RPCResult::Type::STR_AMOUNT, "ancestor", "transaction fees of in-mempool ancestors (including this one) with fee deltas used for mining priority, denominated in " + CURRENCY_UNIT},
                RPCResult{RPCResult::Type::STR_AMOUNT, "descendant", "transaction fees of in-mempool descendants (including this one) with fee deltas used for mining priority, denominated in " + CURRENCY_UNIT},
            }},
        RPCResult{RPCResult::Type::ARR, "depends", "unconfirmed transactions used as inputs for this transaction",
            {RPCResult{RPCResult::Type::STR_HEX, "transactionid", "parent transaction id"}}},
        RPCResult{RPCResult::Type::ARR, "spentby", "unconfirmed transactions spending outputs from this transaction",
            {RPCResult{RPCResult::Type::STR_HEX, "transactionid", "child transaction id"}}},
        RPCResult{RPCResult::Type::BOOL, "bip125-replaceable", "Whether this transaction signals BIP125 replaceability or has an unconfirmed ancestor signaling BIP125 replaceability.\n"},
        RPCResult{RPCResult::Type::BOOL, "unbroadcast", "Whether this transaction is currently unbroadcast (initial broadcast not yet acknowledged by any peers)"},
    };
}